

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTState
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PointerType pdVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ostringstream errorMsg;
  assign_op<double,_double> local_229;
  undefined1 local_228 [16];
  DstEvaluatorType local_218;
  long local_200;
  long local_1f8;
  PointerType local_1f0;
  double local_1e8;
  VectorDynSize *local_1e0;
  DstEvaluatorType local_1d8;
  SrcEvaluatorType local_1c0;
  DstXprType local_1a8;
  ios_base local_138 [264];
  
  local_1e8 = time;
  local_1e0 = control;
  uVar2 = getConstraintsDimension(this);
  uVar3 = iDynTree::MatrixDynSize::rows();
  if (uVar3 == uVar2) {
    lVar4 = iDynTree::MatrixDynSize::cols();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) goto LAB_001486ff;
  }
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,(ulong)uVar2);
LAB_001486ff:
  local_1f0 = (PointerType)iDynTree::MatrixDynSize::data();
  local_1f8 = iDynTree::MatrixDynSize::rows();
  local_200 = iDynTree::MatrixDynSize::cols();
  p_Var7 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_218.
  super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  .m_outerStride.m_value =
       (long)&(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var7 != (_Base_ptr)
                local_218.
                super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                .
                super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                .m_outerStride.m_value) {
    lVar4 = 0;
    do {
      bVar1 = ConstraintsGroup::constraintJacobianWRTState
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2),local_1e8,state,local_1e0
                         ,(MatrixDynSize *)(*(undefined8 **)(p_Var7 + 2) + 6));
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Error while evaluating constraint group ",0x28);
        ConstraintsGroup::name_abi_cxx11_
                  ((string *)local_228,(ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2));
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)local_228._0_8_,local_228._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
        if ((DstEvaluatorType *)local_228._0_8_ != &local_218) {
          operator_delete((void *)local_228._0_8_,
                          (ulong)((long)local_218.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsJacobianWRTState",(char *)local_228._0_8_);
        if ((DstEvaluatorType *)local_228._0_8_ != &local_218) {
          operator_delete((void *)local_228._0_8_,
                          (ulong)((long)local_218.
                                        super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                                        .
                                        super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        .m_data + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      pdVar6 = (PointerType)iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar5 = iDynTree::MatrixDynSize::cols();
      uVar2 = ConstraintsGroup::constraintsDimension
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2));
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_cols.m_value = iDynTree::VectorDynSize::size();
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_rows.m_value = (long)uVar2;
      local_1d8.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_data = local_1f0 + lVar4 * local_200;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_1f0;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = local_1f8;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = local_200;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_outerStride = local_200;
      local_1d8.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_outerStride.m_value = local_200;
      local_228._0_8_ = &local_1d8;
      local_228._8_8_ = &local_1c0;
      local_218.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_data = (PointerType)&local_229;
      local_218.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      ._8_8_ = &local_1a8;
      local_1c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_data = pdVar6;
      local_1c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_outerStride.m_value = lVar5;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_data = local_1d8.
                super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                .
                super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                .m_data;
      local_1a8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_startRow.m_value = lVar4;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_228);
      lVar5 = iDynTree::MatrixDynSize::rows();
      lVar4 = lVar4 + lVar5;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Base_ptr)
                       local_218.
                       super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .
                       super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_outerStride.m_value);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            unsigned int nc = getConstraintsDimension();
            if ((jacobian.rows() != nc) || (jacobian.cols() != state.size())) {
                jacobian.resize(nc, state.size());
            }

            iDynTreeEigenMatrixMap jacobianMap = toEigen(jacobian);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->constraintJacobianWRTState(time, state, control, group.second->stateJacobianBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint group " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                jacobianMap.block(offset, 0, group.second->group_ptr->constraintsDimension(), state.size()) = toEigen(group.second->stateJacobianBuffer);
                offset += group.second->stateJacobianBuffer.rows();
            }
            return true;
        }